

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O3

type_conflict1 __thiscall
llama_model_loader::get_arr_n<unsigned_int>
          (llama_model_loader *this,llm_kv kid,uint *result,bool required)

{
  type_conflict1 tVar1;
  string local_40;
  
  LLM_KV::operator()[abi_cxx11_(&local_40,&this->llm_kv,kid);
  tVar1 = get_arr_n<unsigned_int>(this,&local_40,result,required);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return tVar1;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type
    llama_model_loader::get_arr_n(enum llm_kv kid, T & result, bool required) {
        return get_arr_n(llm_kv(kid), result, required);
    }